

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O2

void btreeblk_reset_subblock_info(btreeblk_handle *handle)

{
  btreeblk_subblocks *pbVar1;
  btreeblk_subblocks *pbVar2;
  ushort uVar3;
  ulong uVar4;
  ulong uVar5;
  
  for (uVar5 = 0; uVar5 < handle->nsb; uVar5 = uVar5 + 1) {
    pbVar2 = handle->sb;
    if (pbVar2[uVar5].bid == 0xffffffffffffffff) {
      uVar3 = pbVar2[uVar5].nblocks;
    }
    else {
      uVar4 = 0;
      while( true ) {
        pbVar1 = pbVar2 + uVar5;
        uVar3 = pbVar2[uVar5].nblocks;
        if (uVar3 <= uVar4) break;
        if (pbVar1->bitmap[uVar4] == '\0') {
          _btreeblk_add_stale_block
                    (handle,(ulong)((int)uVar4 * pbVar1->sb_size) +
                            (ulong)handle->nodesize * pbVar1->bid,pbVar1->sb_size);
          pbVar2 = handle->sb;
        }
        uVar4 = uVar4 + 1;
      }
      pbVar1->bid = 0xffffffffffffffff;
    }
    memset(pbVar2[uVar5].bitmap,0,(ulong)uVar3);
  }
  return;
}

Assistant:

void btreeblk_reset_subblock_info(struct btreeblk_handle *handle)
{
#ifdef __BTREEBLK_SUBBLOCK
    uint32_t sb_no, idx;

    for (sb_no=0;sb_no<handle->nsb;++sb_no){
        if (handle->sb[sb_no].bid != BLK_NOT_FOUND) {
            // first of all, make all unused subblocks as stale
            for (idx=0; idx<handle->sb[sb_no].nblocks; ++idx) {
                if (handle->sb[sb_no].bitmap[idx] == 0) {
                    _btreeblk_add_stale_block(handle,
                        (handle->sb[sb_no].bid * handle->nodesize)
                            + (idx * handle->sb[sb_no].sb_size),
                        handle->sb[sb_no].sb_size);
                }
            }
            handle->sb[sb_no].bid = BLK_NOT_FOUND;
        }
        // clear all info in each subblock set
        memset(handle->sb[sb_no].bitmap, 0, handle->sb[sb_no].nblocks);
    }
#endif
}